

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::sort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  ulong uVar1;
  uint *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  float *pfVar5;
  float fVar6;
  uint uVar7;
  uint *puVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint *__dest;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint *puVar27;
  uint uVar28;
  uint *array_00;
  int size_00;
  long lVar29;
  ulong uVar30;
  
  array_00 = array;
  if (0xf < size) {
    do {
      uVar26 = size;
      uVar21 = (ulong)uVar26;
      if (0x20 < uVar26) {
        puVar16 = (uint *)operator_new__(uVar21 * 4);
        uVar18 = 1;
        bVar10 = false;
        do {
          bVar11 = bVar10;
          __dest = array_00;
          array_00 = puVar16;
          uVar7 = uVar18 * 2;
          puVar16 = array_00;
          uVar22 = 0;
          uVar15 = uVar7;
          uVar14 = uVar18;
          do {
            uVar12 = uVar15;
            if ((int)uVar26 < (int)uVar15) {
              uVar12 = uVar26;
            }
            uVar17 = (long)(int)uVar7 + uVar22;
            uVar13 = (uint)uVar17;
            if ((int)uVar26 < (int)(uint)uVar17) {
              uVar13 = uVar26;
            }
            uVar1 = uVar22 + (long)(int)uVar18;
            uVar19 = (uint)uVar1;
            uVar23 = uVar18 + uVar19;
            if ((int)uVar26 <= (int)(uVar18 + uVar19)) {
              uVar23 = uVar26;
            }
            uVar28 = (uint)uVar22;
            if (((int)uVar18 < 1) || ((long)(int)uVar23 <= (long)uVar1)) {
              lVar29 = (long)(int)uVar28;
              uVar20 = uVar28;
              uVar24 = uVar28;
            }
            else {
              puVar8 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
              uVar25 = uVar22 & 0xffffffff;
              uVar30 = uVar1 & 0xffffffff;
              uVar22 = uVar22 & 0xffffffff;
              puVar27 = puVar16;
              do {
                lVar29 = (long)(int)uVar22;
                puVar2 = __dest + lVar29;
                uVar24 = __dest[(int)uVar30];
                puVar3 = (ulong *)(puVar8 + *puVar2);
                puVar4 = (ulong *)(puVar8 + uVar24);
                fVar6 = *(float *)((long)puVar4 + (*puVar4 >> 0x22) * 4 + 8);
                pfVar5 = (float *)((long)puVar3 + (*puVar3 >> 0x22) * 4 + 8);
                if (fVar6 < *pfVar5 || fVar6 == *pfVar5) {
                  uVar30 = (ulong)((int)uVar30 + 1);
                }
                else {
                  uVar19 = (int)uVar22 + 1;
                  uVar22 = (ulong)uVar19;
                  lVar29 = (long)(int)uVar19;
                  uVar24 = *puVar2;
                }
                uVar19 = (uint)uVar30;
                uVar20 = (uint)uVar22;
                *puVar27 = uVar24;
                uVar24 = (int)uVar25 + 1;
                uVar25 = (ulong)uVar24;
              } while ((lVar29 < (long)uVar1) && (puVar27 = puVar27 + 1, (int)uVar19 < (int)uVar23))
              ;
            }
            if (lVar29 < (long)uVar1) {
              memcpy(array_00 + (int)uVar24,__dest + lVar29,
                     (ulong)(((uVar18 - 1) + uVar28) - uVar20) * 4 + 4);
              uVar24 = (uVar24 + uVar14) - (int)lVar29;
            }
            if ((int)uVar19 < (int)uVar23) {
              memcpy(array_00 + (int)uVar24,__dest + (int)uVar19,(ulong)(uVar13 + ~uVar19) * 4 + 4);
              uVar24 = (uVar24 + uVar12) - uVar19;
            }
            uVar14 = uVar14 + uVar7;
            uVar15 = uVar15 + uVar7;
            puVar16 = puVar16 + (int)uVar7;
            uVar22 = uVar17;
          } while ((long)uVar17 < (long)(uVar21 - (long)(int)uVar18));
          if ((int)uVar24 < (int)uVar26) {
            memcpy(array_00 + (int)uVar24,__dest + (int)uVar24,(ulong)(~uVar24 + uVar26) * 4 + 4);
          }
          puVar16 = __dest;
          uVar18 = uVar7;
          bVar10 = (bool)(bVar11 ^ 1);
        } while ((int)uVar7 < (int)uVar26);
        if (!bVar11) {
          memcpy(__dest,array_00,uVar21 * 4);
          __dest = array_00;
        }
        if (__dest == (uint *)0x0) {
          return;
        }
        operator_delete__(__dest);
        return;
      }
      uVar18 = array_00[uVar26 >> 1];
      puVar16 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
      lVar29 = -1;
      while( true ) {
        fVar6 = *(float *)((long)puVar16 +
                          (ulong)(puVar16[(ulong)uVar18 + 1] & 0xfffffffc) + (ulong)uVar18 * 4 + 8);
        lVar29 = (long)(int)lVar29;
        array = array_00 + lVar29;
        do {
          lVar29 = lVar29 + 1;
          uVar7 = array[1];
          array = array + 1;
          pfVar5 = (float *)((long)(puVar16 + uVar7) + (*(ulong *)(puVar16 + uVar7) >> 0x22) * 4 + 8
                            );
        } while (*pfVar5 <= fVar6 && fVar6 != *pfVar5);
        uVar21 = (ulong)(int)uVar21;
        do {
          lVar9 = uVar21 - 1;
          uVar21 = uVar21 - 1;
        } while (fVar6 < *(float *)((long)(puVar16 + array_00[lVar9]) +
                                   (*(ulong *)(puVar16 + array_00[lVar9]) >> 0x22) * 4 + 8));
        if ((long)uVar21 <= lVar29) break;
        *array = array_00[lVar9];
        array_00[uVar21] = uVar7;
      }
      size_00 = (int)lVar29;
      sort<unsigned_int,reduceDB_lt>(array_00,size_00,lt);
      array_00 = array;
      size = uVar26 - size_00;
    } while (0xf < (int)(uVar26 - size_00));
    size = uVar26 - size_00;
  }
  selectionSort<unsigned_int,reduceDB_lt>(array,size,lt);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}